

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

void __thiscall RationalNum::setDenominator(RationalNum *this,longlong denominator_)

{
  ostream *this_00;
  longlong denominator__local;
  RationalNum *this_local;
  
  if (denominator_ == 0) {
    this->denominator = 1;
    this->numerator = 0;
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Denominator is 0! Not good! THe whole is set to 0.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->denominator = denominator_;
  }
  return;
}

Assistant:

void RationalNum::setDenominator(long long int denominator_) {
    if (denominator_ == 0) {
        denominator = 1;
        numerator = 0;
        cout << "Denominator is 0! Not good! THe whole is set to 0." << endl;
    } else {
        denominator = denominator_;
    }
}